

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestStringGetTemplate(void)

{
  char cVar1;
  bool bVar2;
  Template *tpl;
  Template *pTVar3;
  Strip SVar4;
  TemplateString local_178;
  string cache_key_a;
  string text;
  TemplateString local_118;
  TemplateCache cache1;
  TemplateCache cache2;
  TemplateDictionary empty_dict;
  
  std::__cxx11::string::string((string *)&cache_key_a,"cache key a",(allocator *)&empty_dict);
  std::__cxx11::string::string((string *)&text,"Test template 1",(allocator *)&empty_dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&cache1,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&empty_dict,(TemplateString *)&cache1,(UnsafeArena *)0x0);
  ctemplate::TemplateCache::TemplateCache(&cache1);
  _cache2 = cache_key_a._M_dataplus._M_p;
  local_178.ptr_ = text._M_dataplus._M_p;
  local_178.length_ = text._M_string_length;
  local_178.is_immutable_ = false;
  local_178.id_ = 0;
  SVar4 = (Strip)&local_178;
  cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&cache1,(TemplateString *)&cache2,SVar4);
  if (cVar1 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x8f,
           "cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
    _cache2 = cache_key_a._M_dataplus._M_p;
    local_178.ptr_ = text._M_dataplus._M_p;
    local_178.length_ = text._M_string_length;
    local_178.is_immutable_ = false;
    local_178.id_ = 0;
    cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache1,(TemplateString *)&cache2,SVar4);
    if (cVar1 == '\0') {
      __assert_fail("cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x8f,"static void TemplateCacheUnittest::TestStringGetTemplate()");
    }
  }
  else {
    _cache2 = cache_key_a._M_dataplus._M_p;
    tpl = (Template *)
          ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,(Strip)&cache2);
    ctemplate::AssertExpandIs(tpl,&empty_dict,&text,true);
    ctemplate::TemplateCache::TemplateCache(&cache2);
    local_178.ptr_ = cache_key_a._M_dataplus._M_p;
    local_178.length_ = cache_key_a._M_string_length;
    local_178.is_immutable_ = false;
    local_178.id_ = 0;
    local_118.ptr_ = text._M_dataplus._M_p;
    local_118.length_ = text._M_string_length;
    local_118.is_immutable_ = false;
    local_118.id_ = 0;
    cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache2,&local_178,(Strip)&local_118);
    if (cVar1 == '\0') {
      printf("ASSERT FAILED, line %d: %s\n",0x96,
             "cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
      local_178.ptr_ = cache_key_a._M_dataplus._M_p;
      local_178.length_ = cache_key_a._M_string_length;
      local_178.is_immutable_ = false;
      local_178.id_ = 0;
      local_118.ptr_ = text._M_dataplus._M_p;
      local_118.length_ = text._M_string_length;
      local_118.is_immutable_ = false;
      local_118.id_ = 0;
      cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                        ((TemplateString *)&cache2,&local_178,(Strip)&local_118);
      if (cVar1 == '\0') {
        __assert_fail("cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x96,"static void TemplateCacheUnittest::TestStringGetTemplate()");
      }
    }
    else {
      local_178.ptr_ = cache_key_a._M_dataplus._M_p;
      local_178.length_ = cache_key_a._M_string_length;
      local_178.is_immutable_ = false;
      local_178.id_ = 0;
      pTVar3 = (Template *)ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache2,SVar4);
      if (pTVar3 == tpl) {
        printf("ASSERT FAILED, line %d: %s\n",0x98,"tpl3 != tpl1");
        __assert_fail("tpl3 != tpl1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x98,"static void TemplateCacheUnittest::TestStringGetTemplate()");
      }
      ctemplate::AssertExpandIs(pTVar3,&empty_dict,&text,true);
      local_178.ptr_ = cache_key_a._M_dataplus._M_p;
      local_178.length_ = cache_key_a._M_string_length;
      local_178.is_immutable_ = false;
      local_178.id_ = 0;
      local_118.ptr_ = text._M_dataplus._M_p;
      local_118.length_ = text._M_string_length;
      local_118.is_immutable_ = false;
      local_118.id_ = 0;
      bVar2 = ctemplate::StringToTemplateCache(&local_178,&local_118,DO_NOT_STRIP);
      if (bVar2) {
        local_178.ptr_ = cache_key_a._M_dataplus._M_p;
        local_178.length_ = cache_key_a._M_string_length;
        local_178.is_immutable_ = false;
        local_178.id_ = 0;
        pTVar3 = (Template *)ctemplate::Template::GetTemplate(&local_178,DO_NOT_STRIP);
        if (pTVar3 == tpl) {
          printf("ASSERT FAILED, line %d: %s\n",0x9f,"tpl4 != tpl1");
          __assert_fail("tpl4 != tpl1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x9f,"static void TemplateCacheUnittest::TestStringGetTemplate()");
        }
        ctemplate::AssertExpandIs(pTVar3,&empty_dict,&text,true);
        local_178.ptr_ = cache_key_a._M_dataplus._M_p;
        local_178.length_ = cache_key_a._M_string_length;
        local_178.is_immutable_ = false;
        local_178.id_ = 0;
        ctemplate::TemplateString::TemplateString(&local_118,"new text");
        cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                          ((TemplateString *)&cache1,&local_178,(Strip)&local_118);
        if (cVar1 == '\0') {
          ctemplate::Template::ClearCache();
          ctemplate::TemplateCache::~TemplateCache(&cache2);
          ctemplate::TemplateCache::~TemplateCache(&cache1);
          ctemplate::TemplateDictionary::~TemplateDictionary(&empty_dict);
          std::__cxx11::string::~string((string *)&text);
          std::__cxx11::string::~string((string *)&cache_key_a);
          return;
        }
        printf("ASSERT FAILED, line %d: %s\n",0xa4,
               "!cache1.StringToTemplateCache(cache_key_a, \"new text\", DO_NOT_STRIP)");
        local_178.ptr_ = cache_key_a._M_dataplus._M_p;
        local_178.length_ = cache_key_a._M_string_length;
        local_178.is_immutable_ = false;
        local_178.id_ = 0;
        ctemplate::TemplateString::TemplateString(&local_118,"new text");
        cVar1 = ctemplate::TemplateCache::StringToTemplateCache
                          ((TemplateString *)&cache1,&local_178,(Strip)&local_118);
        if (cVar1 != '\0') {
          __assert_fail("!cache1.StringToTemplateCache(cache_key_a, \"new text\", DO_NOT_STRIP)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0xa4,"static void TemplateCacheUnittest::TestStringGetTemplate()");
        }
      }
      else {
        printf("ASSERT FAILED, line %d: %s\n",0x9d,
               "StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)");
        local_178.ptr_ = cache_key_a._M_dataplus._M_p;
        local_178.length_ = cache_key_a._M_string_length;
        local_178.is_immutable_ = false;
        local_178.id_ = 0;
        local_118.ptr_ = text._M_dataplus._M_p;
        local_118.length_ = text._M_string_length;
        local_118.is_immutable_ = false;
        local_118.id_ = 0;
        bVar2 = ctemplate::StringToTemplateCache(&local_178,&local_118,DO_NOT_STRIP);
        if (!bVar2) {
          __assert_fail("StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x9d,"static void TemplateCacheUnittest::TestStringGetTemplate()");
        }
      }
    }
  }
  exit(1);
}

Assistant:

static void TestStringGetTemplate() {
    // If you use these same cache keys somewhere else,
    // call Template::ClearCache first.
    const string cache_key_a = "cache key a";
    const string text = "Test template 1";
    TemplateDictionary empty_dict("dict");

    TemplateCache cache1;
    const Template *tpl1;
    ASSERT(cache1.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl1 = cache1.GetTemplate(cache_key_a, DO_NOT_STRIP);
    AssertExpandIs(tpl1, &empty_dict, text, true);

    // A different cache should give different templates.
    TemplateCache cache2;
    const Template *tpl3;
    ASSERT(cache2.StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl3 = cache2.GetTemplate(cache_key_a, DO_NOT_STRIP);
    ASSERT(tpl3 != tpl1);
    AssertExpandIs(tpl3, &empty_dict, text, true);

    // And the main cache different still
    const Template *tpl4;
    ASSERT(StringToTemplateCache(cache_key_a, text, DO_NOT_STRIP));
    tpl4 = Template::GetTemplate(cache_key_a, DO_NOT_STRIP);
    ASSERT(tpl4 != tpl1);
    AssertExpandIs(tpl4, &empty_dict, text, true);

    // If we register a new string with the same text, it should be ignored.
    ASSERT(!cache1.StringToTemplateCache(cache_key_a, "new text",
                                         DO_NOT_STRIP));

    Template::ClearCache();
  }